

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

char * mbedtls_ssl_get_version(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_context *ssl_local;
  
  if ((*(uint *)&ssl->conf->field_0x174 >> 1 & 1) == 1) {
    if (ssl->minor_ver == 2) {
      ssl_local = (mbedtls_ssl_context *)anon_var_dwarf_73c3;
    }
    else if (ssl->minor_ver == 3) {
      ssl_local = (mbedtls_ssl_context *)anon_var_dwarf_73da;
    }
    else {
      ssl_local = (mbedtls_ssl_context *)anon_var_dwarf_73e5;
    }
  }
  else {
    switch(ssl->minor_ver) {
    case 0:
      ssl_local = (mbedtls_ssl_context *)anon_var_dwarf_73f0;
      break;
    case 1:
      ssl_local = (mbedtls_ssl_context *)0x1724e9;
      break;
    case 2:
      ssl_local = (mbedtls_ssl_context *)anon_var_dwarf_7406;
      break;
    case 3:
      ssl_local = (mbedtls_ssl_context *)0x1724f2;
      break;
    default:
      ssl_local = (mbedtls_ssl_context *)0x17d59b;
    }
  }
  return (char *)ssl_local;
}

Assistant:

const char *mbedtls_ssl_get_version( const mbedtls_ssl_context *ssl )
{
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        switch( ssl->minor_ver )
        {
            case MBEDTLS_SSL_MINOR_VERSION_2:
                return( "DTLSv1.0" );

            case MBEDTLS_SSL_MINOR_VERSION_3:
                return( "DTLSv1.2" );

            default:
                return( "unknown (DTLS)" );
        }
    }
#endif

    switch( ssl->minor_ver )
    {
        case MBEDTLS_SSL_MINOR_VERSION_0:
            return( "SSLv3.0" );

        case MBEDTLS_SSL_MINOR_VERSION_1:
            return( "TLSv1.0" );

        case MBEDTLS_SSL_MINOR_VERSION_2:
            return( "TLSv1.1" );

        case MBEDTLS_SSL_MINOR_VERSION_3:
            return( "TLSv1.2" );

        default:
            return( "unknown" );
    }
}